

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryCamerasLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryCamerasLoader::begin__camera
          (LibraryCamerasLoader *this,camera__AttributeData *attributeData)

{
  void *pvVar1;
  long *in_RSI;
  long *in_RDI;
  ClassId in_stack_0000008c;
  ParserChar *in_stack_00000090;
  IFilePartLoader *in_stack_00000098;
  String *in_stack_fffffffffffffee8;
  Camera *in_stack_fffffffffffffef0;
  Camera *this_00;
  allocator<char> *in_stack_ffffffffffffff20;
  UniqueId *in_stack_ffffffffffffff28;
  Camera *in_stack_ffffffffffffff30;
  allocator<char> local_a9;
  string local_a8 [39];
  allocator<char> local_81;
  string local_80 [32];
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  DocumentProcessor *in_stack_ffffffffffffffb0;
  long *local_10;
  
  local_10 = in_RSI;
  pvVar1 = operator_new(0x130);
  COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)390>::ID();
  IFilePartLoader::createUniqueIdFromId(in_stack_00000098,in_stack_00000090,in_stack_0000008c);
  COLLADAFW::Camera::Camera(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  in_RDI[4] = (long)pvVar1;
  COLLADAFW::UniqueId::~UniqueId((UniqueId *)&stack0xffffffffffffffd8);
  if (local_10[1] == 0) {
    if (*local_10 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
                 in_stack_ffffffffffffff20);
      COLLADAFW::Camera::setName(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator(&local_81);
    }
  }
  else {
    in_stack_ffffffffffffff20 = (allocator<char> *)in_RDI[4];
    in_stack_ffffffffffffff28 = (UniqueId *)local_10[1];
    in_stack_ffffffffffffff30 = (Camera *)&stack0xffffffffffffffa7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20
              );
    COLLADAFW::Camera::setName(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  }
  if (*local_10 != 0) {
    this_00 = (Camera *)in_RDI[4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20
              );
    COLLADAFW::Camera::setOriginalId(this_00,in_stack_fffffffffffffee8);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  (**(code **)(*in_RDI + 0x10))();
  DocumentProcessor::addToSidTree
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  return true;
}

Assistant:

bool LibraryCamerasLoader::begin__camera( const camera__AttributeData& attributeData )
	{
		mCurrentCamera = FW_NEW COLLADAFW::Camera( createUniqueIdFromId( attributeData.id, COLLADAFW::Camera::ID()) );

		if ( attributeData.name )
			mCurrentCamera->setName( (const char*) attributeData.name );
		else if ( attributeData.id )
			mCurrentCamera->setName( (const char*) attributeData.id );

        if ( attributeData.id )
            mCurrentCamera->setOriginalId ( (const char*)attributeData.id );

		getFileLoader()->addToSidTree( attributeData.id, 0);
		return true;
	}